

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

LabelInstr * __thiscall
BasicBlock::CanProveConditionalBranch
          (BasicBlock *this,BranchInstr *branch,GlobOpt *globOpt,GlobHashTable *localSymToValueMap)

{
  GlobHashTable *pGVar1;
  GlobOpt *branch_00;
  bool bVar2;
  Opnd *pOVar3;
  Instr *this_00;
  BasicBlock *local_90;
  LabelInstr *newTarget;
  Var pvStack_50;
  bool provenTrue;
  Var src2Var;
  Var src1Var;
  Value *src2Val;
  Value *src1Val;
  GlobHashTable *localSymToValueMap_local;
  GlobOpt *globOpt_local;
  BranchInstr *branch_local;
  BasicBlock *this_local;
  
  src2Val = (Value *)0x0;
  src1Var = (Var)0x0;
  src2Var = (Var)0x0;
  pvStack_50 = (Var)0x0;
  src1Val = (Value *)localSymToValueMap;
  localSymToValueMap_local = (GlobHashTable *)globOpt;
  globOpt_local = (GlobOpt *)branch;
  branch_local = (BranchInstr *)this;
  pOVar3 = IR::Instr::GetSrc1(&branch->super_Instr);
  src2Val = GetValueForConditionalBranch
                      (this,branch,pOVar3,(GlobOpt *)localSymToValueMap_local,
                       (GlobHashTable *)src1Val);
  pGVar1 = localSymToValueMap_local;
  if (src2Val == (Value *)0x0) {
    this_local = (BasicBlock *)0x0;
  }
  else {
    pOVar3 = IR::Instr::GetSrc1((Instr *)globOpt_local);
    src2Var = GlobOpt::GetConstantVar((GlobOpt *)pGVar1,pOVar3,src2Val);
    pOVar3 = IR::Instr::GetSrc2((Instr *)globOpt_local);
    branch_00 = globOpt_local;
    if (pOVar3 != (Opnd *)0x0) {
      pOVar3 = IR::Instr::GetSrc2((Instr *)globOpt_local);
      src1Var = GetValueForConditionalBranch
                          (this,(BranchInstr *)branch_00,pOVar3,(GlobOpt *)localSymToValueMap_local,
                           (GlobHashTable *)src1Val);
      pGVar1 = localSymToValueMap_local;
      if ((Value *)src1Var == (Value *)0x0) {
        return (LabelInstr *)0x0;
      }
      pOVar3 = IR::Instr::GetSrc2((Instr *)globOpt_local);
      pvStack_50 = GlobOpt::GetConstantVar((GlobOpt *)pGVar1,pOVar3,(Value *)src1Var);
    }
    bVar2 = GlobOpt::CanProveConditionalBranch
                      ((GlobOpt *)localSymToValueMap_local,(Instr *)globOpt_local,src2Val,
                       (Value *)src1Var,src2Var,pvStack_50,(bool *)((long)&newTarget + 7));
    if (bVar2) {
      if ((newTarget._7_1_ & 1) == 0) {
        this_00 = IR::Instr::GetNextRealInstrOrLabel((Instr *)globOpt_local);
        local_90 = (BasicBlock *)IR::Instr::AsLabelInstr(this_00);
      }
      else {
        local_90 = (BasicBlock *)IR::BranchInstr::GetTarget((BranchInstr *)globOpt_local);
      }
      this_local = local_90;
    }
    else {
      this_local = (BasicBlock *)0x0;
    }
  }
  return (LabelInstr *)this_local;
}

Assistant:

IR::LabelInstr* BasicBlock::CanProveConditionalBranch(IR::BranchInstr *branch, GlobOpt *globOpt, GlobHashTable *localSymToValueMap)
{
    Value *src1Val = nullptr, *src2Val = nullptr;
    Js::Var src1Var = nullptr, src2Var = nullptr;

    src1Val = GetValueForConditionalBranch(branch, branch->GetSrc1(), globOpt, localSymToValueMap);
    if (!src1Val)
    {
        return nullptr;
    }
    src1Var = globOpt->GetConstantVar(branch->GetSrc1(), src1Val);

    if (branch->GetSrc2() != nullptr)
    {
        src2Val = GetValueForConditionalBranch(branch, branch->GetSrc2(), globOpt, localSymToValueMap);
        if (!src2Val)
        {
            return nullptr;
        }
        src2Var = globOpt->GetConstantVar(branch->GetSrc2(), src2Val);
    }

    bool provenTrue;
    if (!globOpt->CanProveConditionalBranch(branch, src1Val, src2Val, src1Var, src2Var, &provenTrue))
    {
        return nullptr;
    }

    IR::LabelInstr * newTarget = provenTrue ? branch->GetTarget() : branch->GetNextRealInstrOrLabel()->AsLabelInstr();

    return newTarget;
}